

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvoidReinterprets.cpp
# Opt level: O1

void __thiscall wasm::AvoidReinterprets::visitUnary(AvoidReinterprets *this,Unary *curr)

{
  PassRunner *pPVar1;
  Module *module;
  key_type pLVar2;
  Expression **ppEVar3;
  mapped_type *pmVar4;
  key_type get;
  key_type local_38;
  Load *load;
  
  if (((ulong)curr->op < 0x2f) && ((0x600600000000U >> ((ulong)curr->op & 0x3f) & 1) != 0)) {
    pPVar1 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>_>
             ).super_Pass.runner;
    module = (this->
             super_WalkerPass<wasm::PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>_>
             ).
             super_PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>
             .super_Walker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>.
             currModule;
    pLVar2 = (key_type)curr->value;
    do {
      get = pLVar2;
      local_38 = get;
      ppEVar3 = Properties::getImmediateFallthroughPtr
                          ((Expression **)&local_38,&pPVar1->options,module,AllowTeeBrIf);
      pLVar2 = (key_type)*ppEVar3;
    } while ((key_type)*ppEVar3 != get);
    if (((((SpecificExpression<(wasm::Expression::Id)8> *)
          &get->super_SpecificExpression<(wasm::Expression::Id)12>)->super_Expression)._id ==
         LocalGetId) &&
       (local_38 = getSingleLoad(this->localGraph,(LocalGet *)get,
                                 &((this->
                                   super_WalkerPass<wasm::PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>_>
                                   ).super_Pass.runner)->options,
                                 (this->
                                 super_WalkerPass<wasm::PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>_>
                                 ).
                                 super_PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>
                                 .
                                 super_Walker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>
                                 .currModule), local_38 != (Load *)0x0)) {
      pmVar4 = std::
               map<wasm::Load_*,_wasm::AvoidReinterprets::Info,_std::less<wasm::Load_*>,_std::allocator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>_>
               ::operator[](&this->infos,&local_38);
      pmVar4->reinterpreted = true;
    }
  }
  return;
}

Assistant:

static bool isReinterpret(Unary* curr) {
  return curr->op == ReinterpretInt32 || curr->op == ReinterpretInt64 ||
         curr->op == ReinterpretFloat32 || curr->op == ReinterpretFloat64;
}